

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asmbbt.c
# Opt level: O2

void bitblt(DLword *srcbase,DLword *dstbase,int sx,int dx,int w,int h,int srcbpl,int dstbpl,
           int backwardflg,int src_comp,int op,int gray,int num_gray,int curr_gray_line)

{
  uint *puVar1;
  DLword *pDVar2;
  uint uVar3;
  uint uVar4;
  sbyte sVar5;
  ulong uVar7;
  long lVar8;
  uint *puVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  uint *puVar19;
  uint uVar20;
  long lVar21;
  int iVar22;
  uint *puVar23;
  uint uVar24;
  uint uVar25;
  uint *puVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint *puVar30;
  uint local_d8;
  uint local_d4;
  uint *local_c8;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  DLword *local_98;
  uint local_90;
  uint local_8c;
  uint local_88;
  sbyte sVar6;
  
  if (gray == 0) {
    local_9c = dstbpl | srcbpl;
    if (backwardflg == 0) {
      if (dx < 0) {
        uVar18 = -(ulong)(7U - dx >> 3);
      }
      else {
        uVar18 = (ulong)((uint)dx >> 3);
      }
      uVar18 = (long)dstbase + uVar18;
      uVar12 = (dx & 7U) + ((uint)uVar18 & 3) * 8;
      uVar14 = (w + uVar12) - 1 & 0x1f;
      local_bc = -1 << (~(byte)uVar14 & 0x1f);
      local_b8 = -(uint)(uVar12 == 0) | ~(-1 << (-(char)uVar12 & 0x1fU));
      if (sx < 0) {
        uVar7 = -(ulong)(7U - sx >> 3);
      }
      else {
        uVar7 = (ulong)((uint)sx >> 3);
      }
      local_a0 = local_bc & local_b8;
      local_b0 = ((int)(uVar12 + w) >> 5) - 1;
      puVar23 = (uint *)(uVar7 + (long)srcbase & 0xfffffffffffffffc);
      uVar27 = (sx & 7U) + ((uint)(uVar7 + (long)srcbase) & 3) * 8;
      local_88 = (w + uVar27) - 1 & 0x1f;
      uVar4 = uVar27 - uVar12 & 0x1f;
      local_8c = uVar12 - uVar27 & 0x1f;
      local_90 = -(uint)(uVar4 == 0) | ~(-1 << (sbyte)uVar4);
    }
    else {
      uVar12 = (dx + w) - 1;
      if (w + dx < 1) {
        uVar18 = -(ulong)(8U - (w + dx) >> 3);
      }
      else {
        uVar18 = (ulong)(uVar12 >> 3);
      }
      uVar18 = (long)dstbase + uVar18;
      uVar14 = (uVar12 & 7) + ((uint)uVar18 & 3) * 8;
      iVar15 = uVar14 - w;
      local_b8 = -1 << (~(byte)uVar14 & 0x1f);
      uVar12 = iVar15 + 1U & 0x1f;
      local_bc = -(uint)(uVar12 == 0) | ~(-1 << (-(char)uVar12 & 0x1fU));
      uVar27 = (uVar14 ^ 0xffffffff) + w;
      local_b0 = uVar27 >> 5;
      if ((int)uVar27 < 1) {
        local_b0 = 0;
      }
      uVar27 = (w + sx) - 1;
      if (w + sx < 1) {
        uVar7 = -(ulong)(8U - (w + sx) >> 3);
      }
      else {
        uVar7 = (ulong)(uVar27 >> 3);
      }
      local_a0 = local_bc & local_b8;
      puVar23 = (uint *)(uVar7 + (long)srcbase & 0xfffffffffffffffc);
      local_88 = (uVar27 & 7) + ((uint)(uVar7 + (long)srcbase) & 3) * 8;
      iVar22 = local_88 - w;
      uVar27 = iVar22 + 1U & 0x1f;
      local_8c = iVar15 - iVar22 & 0x1f;
      uVar4 = iVar22 - iVar15 & 0x1f;
      local_90 = ~(-1 << (sbyte)uVar4);
    }
  }
  else {
    if (dx < 0) {
      uVar18 = -(ulong)(7U - dx >> 3);
    }
    else {
      uVar18 = (ulong)((uint)dx >> 3);
    }
    uVar18 = (long)dstbase + uVar18;
    uVar12 = (dx & 7U) + ((uint)uVar18 & 3) * 8;
    uVar14 = (w + uVar12) - 1 & 0x1f;
    uVar4 = 0;
    local_bc = -1 << (~(byte)uVar14 & 0x1f);
    local_b8 = -(uint)(uVar12 == 0) | ~(-1 << (-(char)uVar12 & 0x1fU));
    local_a0 = local_bc & local_b8;
    local_b0 = ((int)(uVar12 + w) >> 5) - 1;
    uVar27 = sx & 0xf;
    local_90 = 0;
    local_88 = 0;
    local_9c = dstbpl;
    puVar23 = (uint *)0x0;
    local_8c = 0;
  }
  puVar19 = (uint *)(uVar18 & 0xfffffffffffffffc);
  uVar3 = -(uint)(src_comp != 0);
  lVar8 = (long)(dstbpl >> 5);
  uVar13 = 0;
  puVar26 = puVar23;
  local_98 = srcbase;
LAB_001090b2:
  local_d8 = local_b0;
  local_b4 = local_90;
  local_d4 = local_b8;
  local_ac = local_bc;
  local_a4 = local_a0;
  puVar9 = puVar23;
  uVar25 = uVar14;
  uVar17 = local_88;
  uVar24 = local_8c;
  local_c8 = puVar19;
  uVar28 = uVar12;
  uVar10 = uVar27;
  do {
    if (h < 1) {
      return;
    }
    uVar29 = ~local_d4;
    puVar30 = local_c8;
    uVar11 = local_a4;
    if (gray == 0) {
      sVar5 = (sbyte)uVar24;
      sVar6 = (sbyte)uVar4;
      if (backwardflg == 0) {
        uVar16 = *puVar26;
        if ((int)(uVar10 + w) < 0x21 || uVar10 <= uVar28) {
          puVar26 = puVar26 + 1;
          if (uVar28 < uVar10) {
            uVar20 = uVar16 << sVar6;
          }
          else {
            uVar20 = uVar16 >> sVar5 & local_b4;
            uVar13 = uVar16 << sVar6 & ~local_b4;
          }
        }
        else {
          puVar1 = puVar26 + 1;
          puVar26 = puVar26 + 2;
          uVar20 = *puVar1 >> sVar5 & local_b4 | uVar16 << sVar6;
          uVar13 = *puVar1 << sVar6 & ~local_b4;
        }
        uVar20 = uVar20 ^ uVar3;
        if ((int)(uVar28 + w) < 0x21) goto LAB_0010938b;
        uVar11 = *local_c8;
        uVar16 = uVar11;
        switch(op) {
        case 0:
          break;
        case 1:
          uVar20 = uVar20 & uVar11;
          break;
        case 2:
          uVar20 = uVar20 | uVar11;
          break;
        case 3:
          uVar20 = uVar20 ^ uVar11;
          break;
        default:
          goto switchD_001095df_default;
        }
        uVar16 = uVar20;
switchD_001095df_default:
        *local_c8 = uVar16 & local_d4 | uVar11 & uVar29;
        puVar30 = local_c8 + 1;
        if (uVar10 == uVar28) {
          if (src_comp == 0) {
            switch(op) {
            case 0:
              for (uVar11 = local_d8; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
                uVar29 = *puVar26;
                puVar26 = puVar26 + 1;
                *puVar30 = uVar29;
                puVar30 = puVar30 + 1;
              }
              break;
            case 1:
              for (uVar11 = local_d8; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
                uVar29 = *puVar26;
                puVar26 = puVar26 + 1;
                *puVar30 = *puVar30 & uVar29;
                puVar30 = puVar30 + 1;
              }
              break;
            case 2:
              for (uVar11 = local_d8; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
                uVar29 = *puVar26;
                puVar26 = puVar26 + 1;
                *puVar30 = *puVar30 | uVar29;
                puVar30 = puVar30 + 1;
              }
              break;
            case 3:
              for (uVar11 = local_d8; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
                uVar29 = *puVar26;
                puVar26 = puVar26 + 1;
                *puVar30 = *puVar30 ^ uVar29;
                puVar30 = puVar30 + 1;
              }
            }
          }
          else {
            switch(op) {
            case 0:
              for (uVar11 = local_d8; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
                uVar29 = *puVar26;
                puVar26 = puVar26 + 1;
                *puVar30 = ~uVar29;
                puVar30 = puVar30 + 1;
              }
              break;
            case 1:
              for (uVar11 = local_d8; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
                uVar29 = *puVar26;
                puVar26 = puVar26 + 1;
                *puVar30 = *puVar30 & ~uVar29;
                puVar30 = puVar30 + 1;
              }
              break;
            case 2:
              for (uVar11 = local_d8; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
                uVar29 = *puVar26;
                puVar26 = puVar26 + 1;
                *puVar30 = *puVar30 | ~uVar29;
                puVar30 = puVar30 + 1;
              }
              break;
            case 3:
              for (uVar11 = local_d8; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
                uVar29 = *puVar26;
                puVar26 = puVar26 + 1;
                *puVar30 = ~(uVar29 ^ *puVar30);
                puVar30 = puVar30 + 1;
              }
            }
          }
        }
        else if (src_comp == 0) {
          switch(op) {
          case 0:
            for (uVar11 = local_d8; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
              uVar29 = *puVar26;
              puVar26 = puVar26 + 1;
              *puVar30 = uVar29 >> sVar5 | uVar13;
              puVar30 = puVar30 + 1;
              uVar13 = uVar29 << sVar6;
            }
            break;
          case 1:
            for (uVar11 = local_d8; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
              uVar29 = *puVar26;
              *puVar30 = *puVar30 & (uVar29 >> sVar5 | uVar13);
              puVar26 = puVar26 + 1;
              puVar30 = puVar30 + 1;
              uVar13 = uVar29 << sVar6;
            }
            break;
          case 2:
            for (uVar11 = local_d8; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
              uVar29 = *puVar26;
              puVar26 = puVar26 + 1;
              *puVar30 = uVar29 >> sVar5 | *puVar30 | uVar13;
              puVar30 = puVar30 + 1;
              uVar13 = uVar29 << sVar6;
            }
            break;
          case 3:
            for (uVar11 = local_d8; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
              uVar29 = *puVar26;
              *puVar30 = *puVar30 ^ (uVar29 >> sVar5 | uVar13);
              puVar26 = puVar26 + 1;
              puVar30 = puVar30 + 1;
              uVar13 = uVar29 << sVar6;
            }
          }
        }
        else {
          switch(op) {
          case 0:
            for (uVar11 = local_d8; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
              uVar29 = *puVar26;
              puVar26 = puVar26 + 1;
              uVar16 = uVar29 >> sVar5 | uVar13;
              uVar13 = uVar29 << sVar6;
              *puVar30 = ~uVar16;
              puVar30 = puVar30 + 1;
            }
            break;
          case 1:
            for (uVar11 = local_d8; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
              uVar29 = *puVar26 >> sVar5 | uVar13;
              uVar13 = *puVar26 << sVar6;
              *puVar30 = *puVar30 & ~uVar29;
              puVar26 = puVar26 + 1;
              puVar30 = puVar30 + 1;
            }
            break;
          case 2:
            for (uVar11 = local_d8; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
              uVar29 = *puVar26 >> sVar5 | uVar13;
              uVar13 = *puVar26 << sVar6;
              *puVar30 = *puVar30 | ~uVar29;
              puVar26 = puVar26 + 1;
              puVar30 = puVar30 + 1;
            }
            break;
          case 3:
            for (uVar11 = local_d8; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
              uVar29 = *puVar26;
              puVar26 = puVar26 + 1;
              *puVar30 = ~((uVar29 >> sVar5 | uVar13) ^ *puVar30);
              puVar30 = puVar30 + 1;
              uVar13 = uVar29 << sVar6;
            }
          }
        }
        if (uVar25 == 0x1f) goto LAB_001093d3;
        uVar20 = uVar13;
        if (uVar17 <= uVar25) {
          uVar11 = *puVar26 >> sVar5 & local_b4;
          goto LAB_00109cec;
        }
      }
      else {
        if (uVar17 < uVar25) {
          uVar20 = *puVar26 >> sVar5 & local_b4;
          if ((int)(uVar28 + 1) < (int)(uVar10 + w)) {
            puVar1 = puVar26 + -1;
            puVar26 = puVar26 + -2;
            uVar20 = uVar20 | *puVar1 << sVar6;
            uVar13 = *puVar1 >> sVar5 & local_b4;
          }
          else {
            puVar26 = puVar26 + -1;
          }
        }
        else {
          uVar13 = *puVar26;
          puVar26 = puVar26 + -1;
          uVar20 = uVar13 << sVar6;
          uVar13 = uVar13 >> sVar5 & local_b4;
        }
        uVar20 = uVar20 ^ uVar3;
        if ((int)(uVar28 + w) < 0x21) goto LAB_0010938b;
        uVar11 = *local_c8;
        uVar16 = uVar11;
        switch(op) {
        case 0:
          break;
        case 1:
          uVar20 = uVar20 & uVar11;
          break;
        case 2:
          uVar20 = uVar20 | uVar11;
          break;
        case 3:
          uVar20 = uVar20 ^ uVar11;
          break;
        default:
          goto switchD_00109350_default;
        }
        uVar16 = uVar20;
switchD_00109350_default:
        *local_c8 = uVar16 & local_d4 | uVar11 & uVar29;
        puVar30 = local_c8 + -1;
        if (uVar10 == uVar28) {
          if (src_comp == 0) {
            switch(op) {
            case 0:
              for (uVar11 = local_d8; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
                uVar29 = *puVar26;
                puVar26 = puVar26 + -1;
                *puVar30 = uVar29;
                puVar30 = puVar30 + -1;
              }
              break;
            case 1:
              for (uVar11 = local_d8; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
                uVar29 = *puVar26;
                puVar26 = puVar26 + -1;
                *puVar30 = *puVar30 & uVar29;
                puVar30 = puVar30 + -1;
              }
              break;
            case 2:
              for (uVar11 = local_d8; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
                uVar29 = *puVar26;
                puVar26 = puVar26 + -1;
                *puVar30 = *puVar30 | uVar29;
                puVar30 = puVar30 + -1;
              }
              break;
            case 3:
              for (uVar11 = local_d8; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
                uVar29 = *puVar26;
                puVar26 = puVar26 + -1;
                *puVar30 = *puVar30 ^ uVar29;
                puVar30 = puVar30 + -1;
              }
            }
          }
          else {
            switch(op) {
            case 0:
              for (uVar11 = local_d8; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
                uVar29 = *puVar26;
                puVar26 = puVar26 + -1;
                *puVar30 = ~uVar29;
                puVar30 = puVar30 + -1;
              }
              break;
            case 1:
              for (uVar11 = local_d8; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
                uVar29 = *puVar26;
                puVar26 = puVar26 + -1;
                *puVar30 = *puVar30 & ~uVar29;
                puVar30 = puVar30 + -1;
              }
              break;
            case 2:
              for (uVar11 = local_d8; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
                uVar29 = *puVar26;
                puVar26 = puVar26 + -1;
                *puVar30 = *puVar30 | ~uVar29;
                puVar30 = puVar30 + -1;
              }
              break;
            case 3:
              for (uVar11 = local_d8; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
                uVar29 = *puVar26;
                puVar26 = puVar26 + -1;
                *puVar30 = ~(uVar29 ^ *puVar30);
                puVar30 = puVar30 + -1;
              }
            }
          }
        }
        else if (src_comp == 0) {
          switch(op) {
          case 0:
            for (uVar11 = local_d8; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
              uVar29 = *puVar26;
              puVar26 = puVar26 + -1;
              *puVar30 = uVar29 << sVar6 | uVar13;
              puVar30 = puVar30 + -1;
              uVar13 = uVar29 >> sVar5;
            }
            break;
          case 1:
            for (uVar11 = local_d8; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
              uVar29 = *puVar26;
              *puVar30 = *puVar30 & (uVar29 << sVar6 | uVar13);
              puVar26 = puVar26 + -1;
              puVar30 = puVar30 + -1;
              uVar13 = uVar29 >> sVar5;
            }
            break;
          case 2:
            for (uVar11 = local_d8; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
              uVar29 = *puVar26;
              puVar26 = puVar26 + -1;
              *puVar30 = uVar29 << sVar6 | *puVar30 | uVar13;
              puVar30 = puVar30 + -1;
              uVar13 = uVar29 >> sVar5;
            }
            break;
          case 3:
            for (uVar11 = local_d8; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
              uVar29 = *puVar26;
              *puVar30 = *puVar30 ^ (uVar29 << sVar6 | uVar13);
              puVar26 = puVar26 + -1;
              puVar30 = puVar30 + -1;
              uVar13 = uVar29 >> sVar5;
            }
          }
        }
        else {
          switch(op) {
          case 0:
            for (uVar11 = local_d8; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
              uVar29 = *puVar26;
              puVar26 = puVar26 + -1;
              uVar16 = uVar29 << sVar6 | uVar13;
              uVar13 = uVar29 >> sVar5;
              *puVar30 = ~uVar16;
              puVar30 = puVar30 + -1;
            }
            break;
          case 1:
            for (uVar11 = local_d8; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
              uVar29 = *puVar26 << sVar6 | uVar13;
              uVar13 = *puVar26 >> sVar5;
              *puVar30 = *puVar30 & ~uVar29;
              puVar26 = puVar26 + -1;
              puVar30 = puVar30 + -1;
            }
            break;
          case 2:
            for (uVar11 = local_d8; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
              uVar29 = *puVar26 << sVar6 | uVar13;
              uVar13 = *puVar26 >> sVar5;
              *puVar30 = *puVar30 | ~uVar29;
              puVar26 = puVar26 + -1;
              puVar30 = puVar30 + -1;
            }
            break;
          case 3:
            for (uVar11 = local_d8; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
              uVar29 = *puVar26;
              puVar26 = puVar26 + -1;
              *puVar30 = ~((uVar29 << sVar6 | uVar13) ^ *puVar30);
              puVar30 = puVar30 + -1;
              uVar13 = uVar29 >> sVar5;
            }
          }
        }
        if (uVar28 == 0) goto LAB_001093d3;
        uVar20 = uVar13;
        if (uVar28 <= uVar10) {
          uVar11 = *puVar26 << sVar6;
LAB_00109cec:
          uVar20 = uVar11 | uVar13;
        }
      }
      uVar20 = uVar20 ^ uVar3;
      uVar11 = local_ac;
LAB_0010938b:
      uVar29 = *puVar30;
      uVar16 = uVar29;
      switch(op) {
      case 0:
        break;
      case 1:
        uVar20 = uVar20 & uVar29;
        break;
      case 2:
        uVar20 = uVar20 | uVar29;
        break;
      case 3:
        uVar20 = uVar20 ^ uVar29;
        break;
      default:
        goto switchD_001093b1_default;
      }
      uVar16 = uVar20;
switchD_001093b1_default:
      *puVar30 = uVar29 & ~uVar11 | uVar16 & uVar11;
    }
    else {
      uVar4 = uVar10 - uVar28 & 0xf;
      uVar16 = CONCAT22(*local_98,*local_98) << (sbyte)uVar4;
      uVar20 = (uVar16 >> 0x10 | uVar16) ^ uVar3;
      if ((int)(uVar28 + w) < 0x21) goto LAB_0010938b;
      uVar11 = *local_c8;
      if ((uint)op < 4) {
        uVar29 = uVar29 & uVar11;
        switch(op) {
        case 0:
          *local_c8 = uVar20 & local_d4 | uVar29;
          for (uVar11 = local_d8; puVar30 = puVar30 + 1, 0 < (int)uVar11; uVar11 = uVar11 - 1) {
            *puVar30 = uVar20;
          }
          break;
        case 1:
          *local_c8 = uVar11 & uVar20 & local_d4 | uVar29;
          for (uVar11 = local_d8; puVar30 = puVar30 + 1, 0 < (int)uVar11; uVar11 = uVar11 - 1) {
            *puVar30 = *puVar30 & uVar20;
          }
          break;
        case 2:
          *local_c8 = (uVar11 | uVar20) & local_d4 | uVar29;
          for (uVar11 = local_d8; puVar30 = puVar30 + 1, 0 < (int)uVar11; uVar11 = uVar11 - 1) {
            *puVar30 = *puVar30 | uVar20;
          }
          break;
        case 3:
          *local_c8 = (uVar11 ^ uVar20) & local_d4 | uVar29;
          for (uVar11 = local_d8; puVar30 = puVar30 + 1, 0 < (int)uVar11; uVar11 = uVar11 - 1) {
            *puVar30 = *puVar30 ^ uVar20;
          }
        }
      }
      else {
        *local_c8 = uVar11;
        puVar30 = local_c8 + 1;
      }
      uVar11 = local_ac;
      if (uVar25 != 0x1f) goto LAB_0010938b;
    }
LAB_001093d3:
    h = h + -1;
    if (gray != 0) break;
    lVar21 = lVar8;
    uVar18 = (long)(srcbpl >> 5);
    if (backwardflg == 0) {
      if ((local_9c & 0x1f) != 0) {
        uVar29 = uVar28 + dstbpl;
        uVar28 = uVar29 & 0x1f;
        uVar25 = (w + uVar28) - 1 & 0x1f;
        local_d4 = -(uint)(uVar28 == 0) | ~(-1 << (-(char)uVar28 & 0x1fU));
        local_ac = -1 << (~(byte)uVar25 & 0x1f);
        local_a4 = local_ac & local_d4;
        local_d8 = ((int)(w + uVar28) >> 5) - 1;
        uVar11 = uVar10 + srcbpl;
        uVar10 = uVar11 & 0x1f;
        uVar17 = w + 0x1f + uVar11 & 0x1f;
        uVar24 = uVar29 - uVar11 & 0x1f;
        uVar4 = uVar11 - uVar29 & 0x1f;
        local_b4 = -(uint)(uVar4 == 0) | ~(-1 << (sbyte)uVar4);
        lVar21 = (long)((int)uVar29 >> 5);
        uVar18 = (long)((int)uVar11 >> 5);
      }
    }
    else if ((local_9c & 0x1f) != 0) {
      uVar4 = uVar25 + dstbpl;
      lVar21 = -(ulong)(0x1f - uVar4 >> 5);
      if (-1 < (int)uVar4) {
        lVar21 = 0;
      }
      uVar25 = uVar4 & 0x1f;
      iVar15 = uVar4 - w;
      local_d4 = -1 << (~(byte)uVar25 & 0x1f);
      uVar28 = iVar15 + 1U & 0x1f;
      local_ac = -(uint)(uVar28 == 0) | ~(-1 << (-(char)uVar28 & 0x1fU));
      local_a4 = local_ac & local_d4;
      uVar4 = (uVar25 ^ 0xffffffff) + w;
      local_d8 = uVar4 >> 5;
      if ((int)uVar4 < 1) {
        local_d8 = 0;
      }
      uVar4 = uVar17 + srcbpl;
      uVar18 = (ulong)(uVar4 >> 5);
      if ((int)uVar4 < 0) {
        uVar18 = -(ulong)(0x1f - uVar4 >> 5);
      }
      uVar17 = uVar4 & 0x1f;
      iVar22 = uVar4 - w;
      uVar10 = iVar22 + 1U & 0x1f;
      uVar24 = iVar15 - iVar22 & 0x1f;
      uVar4 = iVar22 - iVar15 & 0x1f;
      local_b4 = ~(-1 << (sbyte)uVar4);
    }
    local_c8 = local_c8 + lVar21;
    puVar9 = puVar9 + uVar18;
    puVar26 = puVar9;
  } while( true );
  lVar21 = lVar8;
  if ((local_9c & 0x1f) != 0) {
    uVar25 = uVar12 + dstbpl;
    uVar12 = uVar25 & 0x1f;
    uVar14 = (uVar12 + w) - 1 & 0x1f;
    local_bc = -1 << (~(byte)uVar14 & 0x1f);
    local_b8 = -(uint)(uVar12 == 0) | ~(-1 << (-(char)uVar12 & 0x1fU));
    local_a0 = local_bc & local_b8;
    local_b0 = ((int)(uVar12 + w) >> 5) - 1;
    lVar21 = (long)((int)uVar25 >> 5);
  }
  puVar19 = puVar19 + lVar21;
  iVar15 = curr_gray_line + 1;
  pDVar2 = local_98 + 1;
  local_98 = local_98 + -(long)(num_gray + -1);
  curr_gray_line = 0;
  if (iVar15 < num_gray) {
    curr_gray_line = iVar15;
    local_98 = pDVar2;
  }
  goto LAB_001090b2;
}

Assistant:

void bitblt(DLword *srcbase, DLword *dstbase, int sx, int dx, int w, int h, int srcbpl, int dstbpl,
            int backwardflg, int src_comp, int op, int gray, int num_gray, int curr_gray_line) {
  new_bitblt_code;
}